

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void reset_outdoors(tgestate_t *state)

{
  vischar_t *in_RDI;
  tgestate_t *in_stack_00000010;
  
  calc_vischar_isopos_from_vischar(state,in_RDI);
  *(char *)((long)&in_RDI[0x1a].anim + 1) = (char)((int)(uint)in_RDI[0xf].isopos.x >> 3) + -0xb;
  *(char *)((long)&in_RDI[0x1a].anim + 2) = (char)((int)(uint)in_RDI[0xf].isopos.y >> 3) + -6;
  *(undefined1 *)&in_RDI[4].mi.mappos.u = 0;
  get_supertiles(in_stack_00000010);
  plot_all_tiles(in_stack_00000010);
  setup_movable_items(state);
  zoombox(in_stack_00000010);
  return;
}

Assistant:

void reset_outdoors(tgestate_t *state)
{
  assert(state != NULL);

  /* Reset hero. */
  calc_vischar_isopos_from_vischar(state, &state->vischars[0]);

  /* Centre the map position on the hero. */
  /* Conv: Removed divide_by_8 calls here. */
  state->map_position.x = (state->vischars[0].isopos.x >> 3) - 11; // 11 would be screen width minus half of character width?
  state->map_position.y = (state->vischars[0].isopos.y >> 3) - 6;  // 6 would be screen height minus half of character height?
  ASSERT_MAP_POSITION_VALID(state->map_position);

  state->room_index = room_0_OUTDOORS;
  get_supertiles(state);
  plot_all_tiles(state);
  setup_movable_items(state);
  zoombox(state);
}